

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O3

void BinaryCache::Terminate(void)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if (DAT_0022728c != 0) {
    uVar3 = 0;
    do {
      (*(code *)NULLC::dealloc)(*(undefined8 *)(importPaths + uVar3 * 8));
      uVar3 = uVar3 + 1;
    } while (uVar3 < _DAT_00227288 >> 0x20);
  }
  _DAT_00227288 = _DAT_00227288 & 0xffffffff;
  if (importPaths != 0) {
    (*(code *)NULLC::dealloc)();
  }
  importPaths = 0;
  _DAT_00227288 = 0;
  if (DAT_0022727c != 0) {
    lVar4 = 0;
    uVar3 = 0;
    do {
      (*(code *)NULLC::dealloc)(*(undefined8 *)(cache + lVar4));
      uVar2 = uRam0000000000227278 >> 0x20;
      if (uVar2 <= uVar3) {
LAB_00123a65:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x7f,
                      "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                     );
      }
      pvVar1 = *(void **)(cache + 0x10 + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
        uVar2 = uRam0000000000227278 >> 0x20;
      }
      if (uVar2 <= uVar3) goto LAB_00123a65;
      pvVar1 = *(void **)(cache + 0x18 + lVar4);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
        uVar2 = uRam0000000000227278 >> 0x20;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar3 < uVar2);
  }
  uRam0000000000227278 = uRam0000000000227278 & 0xffffffff;
  if (cache != 0) {
    (*(code *)NULLC::dealloc)();
  }
  cache = 0;
  uRam0000000000227278 = 0;
  if (lastBytecode != (void *)0x0) {
    operator_delete__(lastBytecode);
  }
  lastBytecode = (void *)0x0;
  return;
}

Assistant:

void BinaryCache::ClearImportPaths()
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
		NULLC::dealloc(importPaths[i]);
	importPaths.clear();
}